

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

void qTzSet(void)

{
  long in_FS_OFFSET;
  scoped_lock<QBasicMutex> locker;
  QBasicMutex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>(&local_10);
  tzset();
  std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x25e9c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qTzSet()
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    _tzset();
#else
    tzset();
#endif // Q_OS_WIN
}